

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::parse_rules_word(Parser *this)

{
  int iVar1;
  pointer pbVar2;
  bool bVar3;
  optional<FileSection> oVar4;
  optional<ParsedGame::RulesTokenType> oVar5;
  long lVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  _Storage<ParsedGame::RulesTokenType,_true> _Var7;
  string *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  long lVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_550;
  allocator_type local_54f;
  allocator<char> local_54e;
  allocator<char> local_54d;
  allocator<char> local_54c;
  allocator<char> local_54b;
  allocator<char> local_54a;
  allocator<char> local_549;
  allocator<char> local_548;
  allocator<char> local_547;
  allocator<char> local_546;
  allocator<char> local_545;
  allocator<char> local_544;
  allocator<char> local_543;
  allocator<char> local_542;
  allocator<char> local_541;
  allocator<char> local_540;
  allocator<char> local_53f;
  allocator<char> local_53e;
  allocator<char> local_53d;
  allocator<char> local_53c;
  allocator<char> local_53b;
  allocator<char> local_53a;
  allocator<char> local_539;
  allocator<char> local_538;
  allocator<char> local_537;
  allocator<char> local_536;
  allocator<char> local_535;
  allocator<char> local_534;
  allocator<char> local_533;
  allocator<char> local_532;
  ci_equal comp_equal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_words;
  string parsed_word;
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0;
  string local_490;
  string local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
  local_450;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  local_420;
  undefined1 local_3f0 [8];
  _Alloc_hider local_3e8;
  string local_3d0 [8];
  int local_3c8;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  parse_word_abi_cxx11_(&parsed_word,this);
  std::__cxx11::string::string((string *)&local_470,(string *)&parsed_word);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  ::_Rb_tree(&local_420,&to_file_section_abi_cxx11_._M_t);
  oVar4 = str_to_enum<FileSection>
                    (&local_470,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
                      *)&local_420);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  ::~_Rb_tree(&local_420);
  std::__cxx11::string::~string((string *)&local_470);
  if (oVar4.super__Optional_base<FileSection,_true,_true>._M_payload.
      super__Optional_payload_base<FileSection>._M_payload != None &&
      ((ulong)oVar4.super__Optional_base<FileSection,_true,_true>._M_payload.
              super__Optional_payload_base<FileSection> >> 0x20 & 1) != 0) {
    try_change_file_section
              (this,oVar4.super__Optional_base<FileSection,_true,_true>._M_payload.
                    super__Optional_payload_base<FileSection>._M_payload);
    goto LAB_001361a1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3f0,"NO",&local_550);
  std::__cxx11::string::string<std::allocator<char>>(local_3d0,"LATE",&local_532);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"AGAIN",&local_533);
  std::__cxx11::string::string<std::allocator<char>>(local_390,"MOVING",&local_534);
  std::__cxx11::string::string<std::allocator<char>>(local_370,"STATIONARY",&local_535);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"PARALLEL",&local_536);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"PERPENDICULAR",&local_537);
  std::__cxx11::string::string<std::allocator<char>>(local_310,"HORIZONTAL",&local_538);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"VERTICAL",&local_539);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"ORTHOGONAL",&local_53a);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"ACTION",&local_53b);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"UP",&local_53c);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"DOWN",&local_53d);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"LEFT",&local_53e);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"RIGHT",&local_53f);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"CHECKPOINT",&local_540);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"CANCEL",&local_541);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"WIN",&local_542);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"MESSAGE",&local_543);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"SFX0",&local_544);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"SFX1",&local_545);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"SFX2",&local_546);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"SFX3",&local_547);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"SFX4",&local_548);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"SFX5",&local_549);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"SFX6",&local_54a);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"SFX7",&local_54b);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"SFX8",&local_54c);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"SFX9",&local_54d);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"SFX10",&local_54e);
  __l._M_len = 0x1e;
  __l._M_array = (iterator)local_3f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&reserved_words,__l,&local_54f);
  lVar6 = 0x3a0;
  do {
    std::__cxx11::string::~string((string *)(local_3f0 + lVar6));
    pbVar2 = reserved_words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  local_3f0 = (undefined1  [8])&comp_equal;
  lVar9 = (long)reserved_words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)reserved_words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  __it._M_current =
       reserved_words.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3e8._M_p = (pointer)&parsed_word;
  for (lVar6 = lVar9 >> 7; 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Parser::parse_rules_word()::$_0>::operator()
                      ((_Iter_pred<Parser::parse_rules_word()::__0> *)local_3f0,__it);
    _Var8._M_current = __it._M_current;
    if (bVar3) goto LAB_0013602d;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Parser::parse_rules_word()::$_0>::operator()
                      ((_Iter_pred<Parser::parse_rules_word()::__0> *)local_3f0,__it._M_current + 1)
    ;
    _Var8._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_0013602d;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Parser::parse_rules_word()::$_0>::operator()
                      ((_Iter_pred<Parser::parse_rules_word()::__0> *)local_3f0,__it._M_current + 2)
    ;
    _Var8._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_0013602d;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Parser::parse_rules_word()::$_0>::operator()
                      ((_Iter_pred<Parser::parse_rules_word()::__0> *)local_3f0,__it._M_current + 3)
    ;
    _Var8._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_0013602d;
    __it._M_current = __it._M_current + 4;
    lVar9 = lVar9 + -0x80;
  }
  lVar9 = lVar9 >> 5;
  if (lVar9 == 1) {
LAB_00136014:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Parser::parse_rules_word()::$_0>::operator()
                      ((_Iter_pred<Parser::parse_rules_word()::__0> *)local_3f0,__it);
    _Var8._M_current = pbVar2;
    if (bVar3) {
      _Var8._M_current = __it._M_current;
    }
  }
  else if (lVar9 == 2) {
LAB_00135ff7:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Parser::parse_rules_word()::$_0>::operator()
                      ((_Iter_pred<Parser::parse_rules_word()::__0> *)local_3f0,__it);
    _Var8._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00136014;
    }
  }
  else {
    _Var8._M_current = pbVar2;
    if ((lVar9 == 3) &&
       (bVar3 = __gnu_cxx::__ops::_Iter_pred<Parser::parse_rules_word()::$_0>::operator()
                          ((_Iter_pred<Parser::parse_rules_word()::__0> *)local_3f0,__it),
       _Var8._M_current = __it._M_current, !bVar3)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00135ff7;
    }
  }
LAB_0013602d:
  if (_Var8._M_current ==
      reserved_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string(local_4f0,(string *)&parsed_word);
    iVar1 = this->m_line_counter;
    local_3f0._0_4_ = 0x2a;
    std::__cxx11::string::string((string *)&local_3e8,local_4f0);
    local_3c8 = iVar1;
    std::vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
    ::emplace_back<Token<ParsedGame::RulesTokenType>>
              ((vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
                *)&(this->m_parsed_game).rules_tokens,(Token<ParsedGame::RulesTokenType> *)local_3f0
              );
    std::__cxx11::string::~string((string *)&local_3e8);
    this_00 = local_4f0;
  }
  else {
    std::__cxx11::string::string((string *)&local_490,(string *)&parsed_word);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
    ::_Rb_tree(&local_450,&ParsedGame::to_rules_token_type_abi_cxx11_._M_t);
    oVar5 = str_to_enum<ParsedGame::RulesTokenType>
                      (&local_490,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
                        *)&local_450);
    _Var7._M_value = None;
    if (((ulong)oVar5.super__Optional_base<ParsedGame::RulesTokenType,_true,_true>._M_payload.
                super__Optional_payload_base<ParsedGame::RulesTokenType> & 0x100000000) != 0) {
      _Var7._M_value =
           oVar5.super__Optional_base<ParsedGame::RulesTokenType,_true,_true>._M_payload.
           super__Optional_payload_base<ParsedGame::RulesTokenType>._M_payload;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
    ::~_Rb_tree(&local_450);
    std::__cxx11::string::~string((string *)&local_490);
    if (_Var7._M_value == None) {
      std::__cxx11::string::string((string *)&local_4b0,(string *)&parsed_word);
      detect_error(this,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
    }
    std::__cxx11::string::string<std::allocator<char>>(local_4d0,"",&local_550);
    iVar1 = this->m_line_counter;
    local_3f0._0_4_ = _Var7._M_value;
    std::__cxx11::string::string((string *)&local_3e8,local_4d0);
    local_3c8 = iVar1;
    std::vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
    ::emplace_back<Token<ParsedGame::RulesTokenType>>
              ((vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
                *)&(this->m_parsed_game).rules_tokens,(Token<ParsedGame::RulesTokenType> *)local_3f0
              );
    std::__cxx11::string::~string((string *)&local_3e8);
    this_00 = local_4d0;
  }
  std::__cxx11::string::~string(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&reserved_words);
LAB_001361a1:
  std::__cxx11::string::~string((string *)&parsed_word);
  return;
}

Assistant:

void Parser::parse_rules_word()
{
	string parsed_word = parse_word();

	FileSection fs = str_to_enum(parsed_word, to_file_section).value_or(FileSection::None);

	if(fs != FileSection::None)
	{
		try_change_file_section(fs);
	}
	else
	{
		ci_equal comp_equal;

		vector<string> reserved_words = {
			"NO",
			"LATE",
			"AGAIN",
			"MOVING",
			"STATIONARY",
        	"PARALLEL",
        	"PERPENDICULAR",
        	"HORIZONTAL",
        	"VERTICAL",
			"ORTHOGONAL",
			"ACTION",
			"UP",
			"DOWN",
			"LEFT",
			"RIGHT",
			"CHECKPOINT",
			"CANCEL",
			"WIN",
			"MESSAGE",
			"SFX0", "SFX1","SFX2","SFX3","SFX4","SFX5","SFX6","SFX7","SFX8","SFX9","SFX10"};

		auto found_reserved_word = std::find_if(reserved_words.begin(),reserved_words.end(),[&](const string& s){
			return comp_equal(s, parsed_word);
		});

		if(found_reserved_word != reserved_words.end())
		{
			ParsedGame::RulesTokenType token_type = str_to_enum(parsed_word,ParsedGame::to_rules_token_type).value_or(ParsedGame::RulesTokenType::None);
			if(token_type == ParsedGame::RulesTokenType::None)
			{
				//todo more explicit error message
				detect_error(parsed_word);
			}

			m_parsed_game.rules_tokens.push_back(Token<ParsedGame::RulesTokenType>(token_type,"",m_line_counter));
		}
		else
		{
			m_parsed_game.rules_tokens.push_back(Token<ParsedGame::RulesTokenType>(ParsedGame::RulesTokenType::Identifier,parsed_word,m_line_counter));
		}
	}
}